

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrule.cpp
# Opt level: O1

void __thiscall icu_63::NFRule::_appendRuleText(NFRule *this,UnicodeString *result)

{
  short sVar1;
  int64_t n;
  NFSubstitution *pNVar2;
  int16_t iVar3;
  undefined4 uVar4;
  UnicodeString *pUVar5;
  char16_t *pcVar6;
  int iVar7;
  UnicodeString ruleTextCopy;
  UnicodeString temp;
  UChar local_da;
  UnicodeString local_d8;
  undefined6 *local_98;
  undefined8 *local_88;
  undefined8 *local_78;
  UnicodeString local_68;
  
  n = this->baseValue;
  uVar4 = 0xfffffff9;
  if (n < 1) {
    uVar4 = (undefined4)n;
  }
  switch(uVar4) {
  case 0xfffffffa:
    UnicodeString::doAppend(result,L"NaN",0,3);
    local_78 = &gNaN;
    break;
  case 0xfffffffb:
    UnicodeString::doAppend(result,L"Inf",0,3);
    local_88 = &gInf;
    break;
  case 0xfffffffc:
    local_d8.super_Replaceable.super_UObject._vptr_UObject._0_2_ = 0x78;
    pUVar5 = UnicodeString::doAppend(result,(UChar *)&local_d8,0,1);
    local_d8.super_Replaceable.super_UObject._vptr_UObject._0_2_ = L'.';
    if (this->decimalPoint != L'\0') {
      local_d8.super_Replaceable.super_UObject._vptr_UObject._0_2_ = this->decimalPoint;
    }
    pUVar5 = UnicodeString::doAppend(pUVar5,(UChar *)&local_d8,0,1);
    local_d8.super_Replaceable.super_UObject._vptr_UObject._0_2_ = 0x30;
    goto LAB_0024f437;
  case 0xfffffffd:
    local_d8.super_Replaceable.super_UObject._vptr_UObject._0_2_ = 0x30;
    pUVar5 = UnicodeString::doAppend(result,(UChar *)&local_d8,0,1);
    local_d8.super_Replaceable.super_UObject._vptr_UObject._0_2_ = L'.';
    if (this->decimalPoint != L'\0') {
      local_d8.super_Replaceable.super_UObject._vptr_UObject._0_2_ = this->decimalPoint;
    }
    pUVar5 = UnicodeString::doAppend(pUVar5,(UChar *)&local_d8,0,1);
    local_d8.super_Replaceable.super_UObject._vptr_UObject._0_2_ = 0x78;
    goto LAB_0024f437;
  case 0xfffffffe:
    local_d8.super_Replaceable.super_UObject._vptr_UObject._0_2_ = 0x78;
    pUVar5 = UnicodeString::doAppend(result,(UChar *)&local_d8,0,1);
    local_d8.super_Replaceable.super_UObject._vptr_UObject._0_2_ = L'.';
    if (this->decimalPoint != L'\0') {
      local_d8.super_Replaceable.super_UObject._vptr_UObject._0_2_ = this->decimalPoint;
    }
    pUVar5 = UnicodeString::doAppend(pUVar5,(UChar *)&local_d8,0,1);
    local_d8.super_Replaceable.super_UObject._vptr_UObject._0_2_ = 0x78;
LAB_0024f437:
    UnicodeString::doAppend(pUVar5,(UChar *)&local_d8,0,1);
    break;
  case 0xffffffff:
    UnicodeString::doAppend(result,L"-x",0,2);
    local_98 = &gMinusX;
    break;
  default:
    util_append64(result,n);
    if (this->radix != 10) {
      local_d8.super_Replaceable.super_UObject._vptr_UObject._0_2_ = 0x2f;
      UnicodeString::doAppend(result,(UChar *)&local_d8,0,1);
      util_append64(result,(long)this->radix);
    }
    iVar3 = expectedExponent(this);
    iVar7 = (int)iVar3 - (int)this->exponent;
    if (iVar7 != 0 && (int)this->exponent <= (int)iVar3) {
      do {
        local_d8.super_Replaceable.super_UObject._vptr_UObject._0_2_ = 0x3e;
        UnicodeString::doAppend(result,(UChar *)&local_d8,0,1);
        iVar7 = iVar7 + -1;
      } while (iVar7 != 0);
    }
  }
  local_d8.super_Replaceable.super_UObject._vptr_UObject._0_2_ = 0x3a;
  UnicodeString::doAppend(result,(UChar *)&local_d8,0,1);
  local_d8.super_Replaceable.super_UObject._vptr_UObject._0_2_ = 0x20;
  UnicodeString::doAppend(result,(UChar *)&local_d8,0,1);
  sVar1 = (this->fRuleText).fUnion.fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar7 = (this->fRuleText).fUnion.fFields.fLength;
  }
  else {
    iVar7 = (int)sVar1 >> 5;
  }
  if (iVar7 != 0) {
    if (((int)sVar1 & 2U) == 0) {
      pcVar6 = (this->fRuleText).fUnion.fFields.fArray;
    }
    else {
      pcVar6 = (this->fRuleText).fUnion.fStackFields.fBuffer;
    }
    if ((*pcVar6 == L' ') && ((this->sub1 == (NFSubstitution *)0x0 || (this->sub1->pos != 0)))) {
      local_d8.super_Replaceable.super_UObject._vptr_UObject._0_2_ = 0x27;
      UnicodeString::doAppend(result,(UChar *)&local_d8,0,1);
    }
  }
  local_d8.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003b5258;
  local_d8.fUnion.fStackFields.fLengthAndFlags = 2;
  UnicodeString::copyFrom(&local_d8,&this->fRuleText,'\0');
  local_68.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003b5258;
  local_68.fUnion.fStackFields.fLengthAndFlags = 2;
  pNVar2 = this->sub2;
  if (pNVar2 != (NFSubstitution *)0x0) {
    (*(pNVar2->super_UObject)._vptr_UObject[5])(pNVar2,&local_68);
    uVar4 = local_68.fUnion.fFields.fLength;
    if (-1 < local_68.fUnion.fStackFields.fLengthAndFlags) {
      uVar4 = (int)local_68.fUnion.fStackFields.fLengthAndFlags >> 5;
    }
    UnicodeString::doReplace(&local_d8,this->sub2->pos,0,&local_68,0,uVar4);
  }
  pNVar2 = this->sub1;
  if (pNVar2 != (NFSubstitution *)0x0) {
    (*(pNVar2->super_UObject)._vptr_UObject[5])(pNVar2,&local_68);
    if (-1 < local_68.fUnion.fStackFields.fLengthAndFlags) {
      local_68.fUnion.fFields.fLength = (int)local_68.fUnion.fStackFields.fLengthAndFlags >> 5;
    }
    UnicodeString::doReplace
              (&local_d8,this->sub1->pos,0,&local_68,0,local_68.fUnion.fFields.fLength);
  }
  if (-1 < local_d8.fUnion.fStackFields.fLengthAndFlags) {
    local_d8.fUnion.fFields.fLength = (int)local_d8.fUnion.fStackFields.fLengthAndFlags >> 5;
  }
  UnicodeString::doAppend(result,&local_d8,0,local_d8.fUnion.fFields.fLength);
  local_da = L';';
  UnicodeString::doAppend(result,&local_da,0,1);
  UnicodeString::~UnicodeString(&local_68);
  UnicodeString::~UnicodeString(&local_d8);
  return;
}

Assistant:

void
NFRule::_appendRuleText(UnicodeString& result) const
{
    switch (getType()) {
    case kNegativeNumberRule: result.append(gMinusX, 2); break;
    case kImproperFractionRule: result.append(gX).append(decimalPoint == 0 ? gDot : decimalPoint).append(gX); break;
    case kProperFractionRule: result.append(gZero).append(decimalPoint == 0 ? gDot : decimalPoint).append(gX); break;
    case kMasterRule: result.append(gX).append(decimalPoint == 0 ? gDot : decimalPoint).append(gZero); break;
    case kInfinityRule: result.append(gInf, 3); break;
    case kNaNRule: result.append(gNaN, 3); break;
    default:
        // for a normal rule, write out its base value, and if the radix is
        // something other than 10, write out the radix (with the preceding
        // slash, of course).  Then calculate the expected exponent and if
        // if isn't the same as the actual exponent, write an appropriate
        // number of > signs.  Finally, terminate the whole thing with
        // a colon.
        util_append64(result, baseValue);
        if (radix != 10) {
            result.append(gSlash);
            util_append64(result, radix);
        }
        int numCarets = expectedExponent() - exponent;
        for (int i = 0; i < numCarets; i++) {
            result.append(gGreaterThan);
        }
        break;
    }
    result.append(gColon);
    result.append(gSpace);

    // if the rule text begins with a space, write an apostrophe
    // (whitespace after the rule descriptor is ignored; the
    // apostrophe is used to make the whitespace significant)
    if (fRuleText.charAt(0) == gSpace && (sub1 == NULL || sub1->getPos() != 0)) {
        result.append(gTick);
    }

    // now, write the rule's rule text, inserting appropriate
    // substitution tokens in the appropriate places
    UnicodeString ruleTextCopy;
    ruleTextCopy.setTo(fRuleText);

    UnicodeString temp;
    if (sub2 != NULL) {
        sub2->toString(temp);
        ruleTextCopy.insert(sub2->getPos(), temp);
    }
    if (sub1 != NULL) {
        sub1->toString(temp);
        ruleTextCopy.insert(sub1->getPos(), temp);
    }

    result.append(ruleTextCopy);

    // and finally, top the whole thing off with a semicolon and
    // return the result
    result.append(gSemicolon);
}